

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

suffix_table_type * __thiscall
frozen::boyer_moore_searcher<5UL>::build_suffix_table
          (suffix_table_type *__return_storage_ptr__,boyer_moore_searcher<5UL> *this,
          char (*needle) [6])

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  long local_48 [4];
  suffix_table_type suffix;
  
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  suffix.data_[0] = 0;
  cVar4 = (*needle)[0];
  lVar7 = 4;
  lVar6 = 0;
  lVar8 = 4;
  do {
    lVar1 = lVar8 + 1;
    if (lVar1 == 5) {
LAB_0018504c:
      lVar7 = lVar1;
    }
    else if (cVar4 == (*needle)[lVar1]) {
      pcVar9 = *needle;
      lVar5 = -1;
      do {
        lVar10 = lVar5;
        if (lVar6 == lVar10) break;
        pcVar2 = pcVar9 + 1;
        pcVar3 = pcVar9 + lVar6 + 6;
        pcVar9 = pcVar9 + 1;
        lVar5 = lVar10 + -1;
      } while (*pcVar2 == *pcVar3);
      if (4U - lVar8 <= (ulong)-lVar10) goto LAB_0018504c;
    }
    local_48[lVar8] = (lVar7 - lVar8) + 4;
    lVar6 = lVar6 + -1;
    bVar11 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar11) {
      lVar7 = 0;
      do {
        if (lVar7 == 0) {
          lVar6 = 0;
        }
        else {
          lVar8 = 0;
          pcVar9 = *needle + 4;
          do {
            lVar6 = lVar8;
            if (pcVar9[lVar7 + -4] != *pcVar9) break;
            lVar8 = lVar8 + 1;
            pcVar9 = pcVar9 + -1;
            lVar6 = lVar7;
          } while (lVar7 != lVar8);
        }
        if (*(char *)((long)needle + (lVar7 - lVar6)) != *(char *)((long)needle + (4 - lVar6))) {
          local_48[4 - lVar6] = (lVar6 - lVar7) + 4;
        }
        lVar7 = lVar7 + 1;
        if (lVar7 == 4) {
          __return_storage_ptr__->data_[4] = suffix.data_[0];
          __return_storage_ptr__->data_[2] = local_48[2];
          __return_storage_ptr__->data_[3] = local_48[3];
          __return_storage_ptr__->data_[0] = local_48[0];
          __return_storage_ptr__->data_[1] = local_48[1];
          return __return_storage_ptr__;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

constexpr auto build_suffix_table(char const (&needle)[size + 1]) {
    suffix_table_type suffix;
    std::ptrdiff_t last_prefix_index = size - 1;

    // first loop
    for (std::ptrdiff_t p = size - 1; p >= 0; p--) {
      if (is_prefix(needle, p + 1))
        last_prefix_index = p + 1;

      suffix[p] = last_prefix_index + (size - 1 - p);
    }

    // second loop
    for (std::size_t p = 0; p < size - 1; p++) {
      auto slen = suffix_length(needle, p);
      if (needle[p - slen] != needle[size - 1 - slen])
        suffix[size - 1 - slen] = size - 1 - p + slen;

    }
    return suffix;
  }